

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_int,_char_*> * __thiscall
fmt::v9::make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,int&,char*&>
          (format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_int,_char_*>
           *__return_storage_ptr__,v9 *this,int *args,char **args_1)

{
  longlong lVar1;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_const_1;
  bool formattable_char_1;
  char_type **arg_1;
  longlong local_e8;
  size_t local_e0;
  char **args_local_1;
  int *args_local;
  size_t local_50;
  bool formattable;
  bool formattable_pointer;
  bool formattable_const;
  bool formattable_char;
  int *arg;
  
  local_e8._0_4_ = *(undefined4 *)this;
  lVar1 = *(longlong *)args;
  (__return_storage_ptr__->data_).args_[0].field_0.long_long_value = local_e8;
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = local_e0;
  (__return_storage_ptr__->data_).args_[1].field_0.long_long_value = lVar1;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_50;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(Args&&... args)
    -> format_arg_store<Context, remove_cvref_t<Args>...> {
  return {FMT_FORWARD(args)...};
}